

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::aggreports
          (aggreports *this,int totalperiods,FILE **fout,bool useReturnPeriodFile,bool *outputFlags,
          bool ordFlag,string *parquetFileNames,char *progname)

{
  _Rb_tree_header *p_Var1;
  initializer_list<std::pair<const_int,_bool>_> __l;
  initializer_list<std::pair<const_int,_bool>_> __l_00;
  allocator_type local_6a;
  less<int> local_69;
  pair<const_int,_bool> local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this->totalperiods_ = totalperiods;
  p_Var1 = &(this->summaryids_)._M_t._M_impl.super__Rb_tree_header;
  (this->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->fout_ = fout;
  this->useReturnPeriodFile_ = useReturnPeriodFile;
  this->outputFlags_ = outputFlags;
  this->ordFlag_ = ordFlag;
  this->parquetFileNames_ = parquetFileNames;
  this->progname_ = progname;
  this->eptHeader_ = true;
  this->pseptHeader_ = true;
  local_68.first = 0;
  local_68.second = true;
  local_68._5_3_ = 0;
  uStack_60 = 1;
  local_58 = 3;
  __l._M_len = 3;
  __l._M_array = &local_68;
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            (&this->wheatSheaf_,__l,&local_69,&local_6a);
  (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
  (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header;
  (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = 6;
  uStack_30 = 7;
  local_48 = 4;
  uStack_40 = 5;
  local_58 = 2;
  uStack_50 = 3;
  local_68.first = 0;
  local_68.second = false;
  local_68._5_3_ = 0;
  uStack_60 = 1;
  __l_00._M_len = 8;
  __l_00._M_array = &local_68;
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            (&this->fileHeaders_,__l_00,&local_69,&local_6a);
  this->WritePSEPTOutput = 0;
  *(undefined8 *)&this->field_0x168 = 0;
  this->WriteEPTOutput = 0;
  *(undefined8 *)&this->field_0x158 = 0;
  this->GetAgg = (offset_in_OutLosses_to_subr)OutLosses::GetAggOutLoss;
  *(undefined8 *)&this->field_0x178 = 0;
  this->GetMax = (offset_in_OutLosses_to_subr)OutLosses::GetMaxOutLoss;
  *(undefined8 *)&this->field_0x188 = 0;
  LoadReturnPeriods(this);
  LoadPeriodsToWeighting(this);
  return;
}

Assistant:

aggreports::aggreports(const int totalperiods, FILE **fout,
		       const bool useReturnPeriodFile, bool *outputFlags,
		       const bool ordFlag, const std::string *parquetFileNames,
		       const char *progname) :
	totalperiods_(totalperiods), fout_(fout),
	useReturnPeriodFile_(useReturnPeriodFile), outputFlags_(outputFlags),
	ordFlag_(ordFlag), parquetFileNames_(parquetFileNames),
	progname_(progname)
{

  LoadReturnPeriods();
  LoadPeriodsToWeighting();

}